

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QPlaceHolderItem::QPlaceHolderItem(QPlaceHolderItem *this,QWidget *w)

{
  qsizetype qVar1;
  QWidgetData *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  uint uVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->objectName).d.size = 0;
  (this->objectName).d.d = (Data *)0x0;
  (this->objectName).d.ptr = (char16_t *)0x0;
  (this->topLevelRect).x1 = 0;
  (this->topLevelRect).y1 = 0;
  (this->topLevelRect).x2 = -1;
  (this->topLevelRect).y2 = -1;
  QObject::objectName();
  pDVar6 = (this->objectName).d.d;
  pcVar7 = (this->objectName).d.ptr;
  (this->objectName).d.d = local_38.d;
  (this->objectName).d.ptr = local_38.ptr;
  qVar1 = (this->objectName).d.size;
  (this->objectName).d.size = local_38.size;
  local_38.d = pDVar6;
  local_38.ptr = pcVar7;
  local_38.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  pQVar2 = w->data;
  this->hidden = (bool)(*(byte *)((long)&pQVar2->widget_attributes + 2) & 1);
  uVar8 = (pQVar2->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1;
  this->window = SUB41(uVar8,0);
  if (uVar8 != 0) {
    iVar3 = (pQVar2->crect).y1.m_i;
    iVar4 = (pQVar2->crect).x2.m_i;
    iVar5 = (pQVar2->crect).y2.m_i;
    (this->topLevelRect).x1.m_i = (pQVar2->crect).x1.m_i;
    (this->topLevelRect).y1.m_i = iVar3;
    (this->topLevelRect).x2.m_i = iVar4;
    (this->topLevelRect).y2.m_i = iVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPlaceHolderItem::QPlaceHolderItem(QWidget *w)
{
    objectName = w->objectName();
    hidden = w->isHidden();
    window = w->isWindow();
    if (window)
        topLevelRect = w->geometry();
}